

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::GetInterpolationOrder
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,TPZVec<int> *ord)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x90))();
  (*ord->_vptr_TPZVec[3])(ord,(long)iVar1);
  uVar2 = 0;
  while( true ) {
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if ((long)iVar1 <= (long)uVar2) break;
    iVar1 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapePrism>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x3c0))(this,uVar2 & 0xffffffff);
    ord->fStore[uVar2] = iVar1;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::GetInterpolationOrder(TPZVec<int> &ord) {
	ord.Resize(NConnects());
	int i;
	for(i=0; i<NConnects(); i++) {
		ord[i] = ConnectOrder(i);
	}
}